

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O0

CURLcode __thiscall
curlpp::internal::CurlHandle::executeSslCtxFunctor(CurlHandle *this,void *ssl_ctx)

{
  bool bVar1;
  CallbackExceptionBase *e_00;
  CurlHandle *in_RDI;
  CallbackExceptionBase *e;
  LogicError *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffffd8;
  LogicError *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  bVar1 = utilspp::Functor<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_>::operator!
                    ((Functor<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_> *)
                     0x14e7b4);
  if (bVar1) {
    e_00 = (CallbackExceptionBase *)operator_new(0x20);
    LogicError::LogicError(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    CallbackException<curlpp::LogicError>::CallbackException
              ((CallbackException<curlpp::LogicError> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    setException(in_RDI,e_00);
    LogicError::~LogicError((LogicError *)0x14e813);
    local_4 = CURLE_ABORTED_BY_CALLBACK;
  }
  else {
    local_4 = utilspp::Functor<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_>::
              operator()((Functor<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
  }
  return local_4;
}

Assistant:

CURLcode 
CurlHandle::executeSslCtxFunctor(void * ssl_ctx)
{
	if (!mSslFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mSslFunctor(ssl_ctx);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}